

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O0

void __thiscall SocketManager::SMMLF::exit_all(SMMLF *this)

{
  SMMLF *in_RDI;
  
  server_exit((SMMLF *)0x108a08);
  client_exit(in_RDI);
  return;
}

Assistant:

void SocketManager::SMMLF::exit_all() {
    server_exit();
    client_exit();
}